

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
checkOptions(HighsLogOptions *report_log_options,
            vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records)

{
  HighsOptionType HVar1;
  OptionRecord *pOVar2;
  pointer pcVar3;
  OptionRecordDouble *option;
  _func_int **pp_Var4;
  OptionRecord *pOVar5;
  OptionRecordInt *option_00;
  undefined1 *puVar6;
  bool bVar7;
  int iVar8;
  OptionStatus OVar9;
  HighsInt check_index_1;
  undefined1 *puVar10;
  HighsInt check_index;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  string name;
  string check_name;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  uVar12 = (uint)((ulong)((long)(option_records->
                                super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(option_records->
                               super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar12) {
    uVar13 = (ulong)(uVar12 & 0x7fffffff);
    uVar14 = 0;
    bVar7 = false;
    do {
      local_70 = local_60;
      pOVar2 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)
               ._M_impl.super__Vector_impl_data._M_start[uVar14];
      pcVar3 = (pOVar2->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (pOVar2->name)._M_string_length);
      HVar1 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar14]->type;
      uVar11 = 0;
      do {
        if (uVar14 != uVar11) {
          pOVar2 = (option_records->
                   super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          local_50 = local_40;
          pcVar3 = (pOVar2->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar3,pcVar3 + (pOVar2->name)._M_string_length);
          puVar10 = local_50;
          puVar6 = local_70;
          if ((local_48 == local_68) &&
             ((local_48 == 0 || (iVar8 = bcmp(local_50,local_70,local_48), iVar8 == 0)))) {
            highsLogUser(report_log_options,kError,
                         "checkOptions: Option %d (\"%s\") has the same name as option %d \"%s\"\n",
                         uVar14 & 0xffffffff,puVar6,uVar11 & 0xffffffff,puVar10);
            bVar7 = true;
            puVar10 = local_50;
          }
          if (puVar10 != local_40) {
            operator_delete(puVar10);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
      switch(HVar1) {
      case kBool:
        pOVar2 = (option_records->
                 super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
        pp_Var4 = pOVar2[1]._vptr_OptionRecord;
        uVar11 = 0;
        do {
          if (((uVar14 != uVar11) &&
              (pOVar5 = (option_records->
                        super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[uVar11], pOVar5->type == kBool)) &&
             (pOVar5[1]._vptr_OptionRecord == pp_Var4)) {
            bVar7 = true;
            highsLogUser(report_log_options,kError,
                         "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                         ,uVar14 & 0xffffffff,(pOVar2->name)._M_dataplus._M_p,uVar11 & 0xffffffff,
                         (pOVar5->name)._M_dataplus._M_p);
          }
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
        break;
      case kInt:
        option_00 = (OptionRecordInt *)
                    (option_records->
                    super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar14];
        OVar9 = checkOption(report_log_options,option_00);
        pp_Var4 = (_func_int **)option_00->value;
        bVar7 = (bool)(bVar7 | OVar9 != kOk);
        uVar11 = 0;
        do {
          if (((uVar14 != uVar11) &&
              (pOVar2 = (option_records->
                        super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[uVar11], pOVar2->type == kInt)) &&
             (pOVar2[1]._vptr_OptionRecord == pp_Var4)) {
            bVar7 = true;
            highsLogUser(report_log_options,kError,
                         "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                         ,uVar14 & 0xffffffff,(option_00->super_OptionRecord).name._M_dataplus._M_p,
                         uVar11 & 0xffffffff,(pOVar2->name)._M_dataplus._M_p);
          }
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
        break;
      case kDouble:
        option = (OptionRecordDouble *)
                 (option_records->
                 super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
        OVar9 = checkOption(report_log_options,option);
        pp_Var4 = (_func_int **)option->value;
        bVar7 = (bool)(bVar7 | OVar9 != kOk);
        uVar11 = 0;
        do {
          if (((uVar14 != uVar11) &&
              (pOVar2 = (option_records->
                        super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[uVar11], pOVar2->type == kDouble)) &&
             (pOVar2[1]._vptr_OptionRecord == pp_Var4)) {
            bVar7 = true;
            highsLogUser(report_log_options,kError,
                         "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                         ,uVar14 & 0xffffffff,(option->super_OptionRecord).name._M_dataplus._M_p,
                         uVar11 & 0xffffffff,(pOVar2->name)._M_dataplus._M_p);
          }
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
        break;
      case kString:
        pOVar2 = (option_records->
                 super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
        pp_Var4 = pOVar2[1]._vptr_OptionRecord;
        uVar11 = 0;
        do {
          if (((uVar14 != uVar11) &&
              (pOVar5 = (option_records->
                        super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[uVar11], pOVar5->type == kString)) &&
             (pOVar5[1]._vptr_OptionRecord == pp_Var4)) {
            bVar7 = true;
            highsLogUser(report_log_options,kError,
                         "checkOptions: Option %d (\"%s\") has the same value pointer as option %d (\"%s\")\n"
                         ,uVar14 & 0xffffffff,(pOVar2->name)._M_dataplus._M_p,uVar11 & 0xffffffff,
                         (pOVar5->name)._M_dataplus._M_p);
          }
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13);
    if (bVar7) {
      return kIllegalValue;
    }
  }
  highsLogUser(report_log_options,kInfo,"checkOptions: Options are OK\n");
  return kOk;
}

Assistant:

OptionStatus checkOptions(const HighsLogOptions& report_log_options,
                          const std::vector<OptionRecord*>& option_records) {
  bool error_found = false;
  HighsInt num_options = option_records.size();
  for (HighsInt index = 0; index < num_options; index++) {
    std::string name = option_records[index]->name;
    HighsOptionType type = option_records[index]->type;
    // Check that there are no other options with the same name
    for (HighsInt check_index = 0; check_index < num_options; check_index++) {
      if (check_index == index) continue;
      std::string check_name = option_records[check_index]->name;
      if (check_name == name) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "checkOptions: Option %" HIGHSINT_FORMAT
                     " (\"%s\") has the same name as "
                     "option %" HIGHSINT_FORMAT " \"%s\"\n",
                     index, name.c_str(), check_index, check_name.c_str());
        error_found = true;
      }
    }
    if (type == HighsOptionType::kBool) {
      // Check bool option
      OptionRecordBool& option = ((OptionRecordBool*)option_records[index])[0];
      // Check that there are no other options with the same value pointers
      bool* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kBool) {
          OptionRecordBool& check_option =
              ((OptionRecordBool*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsOptionType::kInt) {
      // Check HighsInt option
      OptionRecordInt& option = ((OptionRecordInt*)option_records[index])[0];
      if (checkOption(report_log_options, option) != OptionStatus::kOk)
        error_found = true;
      // Check that there are no other options with the same value pointers
      HighsInt* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kInt) {
          OptionRecordInt& check_option =
              ((OptionRecordInt*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsOptionType::kDouble) {
      // Check double option
      OptionRecordDouble& option =
          ((OptionRecordDouble*)option_records[index])[0];
      if (checkOption(report_log_options, option) != OptionStatus::kOk)
        error_found = true;
      // Check that there are no other options with the same value pointers
      double* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kDouble) {
          OptionRecordDouble& check_option =
              ((OptionRecordDouble*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    } else if (type == HighsOptionType::kString) {
      // Check string option
      OptionRecordString& option =
          ((OptionRecordString*)option_records[index])[0];
      // Check that there are no other options with the same value pointers
      std::string* value_pointer = option.value;
      for (HighsInt check_index = 0; check_index < num_options; check_index++) {
        if (check_index == index) continue;
        if (option_records[check_index]->type == HighsOptionType::kString) {
          OptionRecordString& check_option =
              ((OptionRecordString*)option_records[check_index])[0];
          if (check_option.value == value_pointer) {
            highsLogUser(report_log_options, HighsLogType::kError,
                         "checkOptions: Option %" HIGHSINT_FORMAT
                         " (\"%s\") has the same "
                         "value pointer as option %" HIGHSINT_FORMAT
                         " (\"%s\")\n",
                         index, option.name.c_str(), check_index,
                         check_option.name.c_str());
            error_found = true;
          }
        }
      }
    }
  }
  if (error_found) return OptionStatus::kIllegalValue;
  highsLogUser(report_log_options, HighsLogType::kInfo,
               "checkOptions: Options are OK\n");
  return OptionStatus::kOk;
}